

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O1

void __thiscall Num::Num(Num *this,string *str,Short k)

{
  (this->base)._M_dataplus._M_p = (pointer)&(this->base).field_2;
  (this->base)._M_string_length = 0;
  (this->base).field_2._M_local_buf[0] = '\0';
  this->size = k;
  std::__cxx11::string::_M_assign((string *)&this->base);
  return;
}

Assistant:

Num::Num(std::string& str, Short k)  // constructor that create number using a string
{
    size = k;
    base = str;
}